

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard.c
# Opt level: O1

void cod_process_include(char *name,cod_parse_context context)

{
  int iVar1;
  char *pcVar2;
  cod_extern_entry *externs;
  size_t __n;
  
  pcVar2 = strchr(name,0x2e);
  __n = (long)pcVar2 - (long)name;
  if ((long)__n < 0) {
    __n = strlen(name);
  }
  iVar1 = strncmp(name,"string",__n);
  if (iVar1 == 0) {
    pcVar2 = string_extern_string;
    externs = string_externs;
  }
  else {
    iVar1 = strncmp(name,"math",__n);
    if (iVar1 != 0) {
      iVar1 = strncmp(name,"limits",__n);
      if (iVar1 != 0) {
        return;
      }
      pcVar2 = limits_extern_string;
      goto LAB_0012c8f3;
    }
    pcVar2 = math_extern_string;
    externs = math_externs;
  }
  cod_assoc_externs(context,externs);
LAB_0012c8f3:
  cod_parse_for_context(pcVar2,context);
  return;
}

Assistant:

extern void
cod_process_include(char *name, cod_parse_context context)
{
    intptr_t char_count = strchr(name, '.') - name;
    if (char_count < 0) char_count = strlen(name);
    if (strncmp(name, "string", char_count) == 0) {
	cod_assoc_externs(context, string_externs);
	cod_parse_for_context(string_extern_string, context);
    } else if (strncmp(name, "math", char_count) == 0) {
	dlload_externs("libm", math_externs);
	cod_assoc_externs(context, math_externs);
	cod_parse_for_context(math_extern_string, context);
    } else if (strncmp(name, "limits", char_count) == 0) {
	cod_parse_for_context(limits_extern_string, context);
    }

}